

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexture.cpp
# Opt level: O0

void __thiscall
tcu::PixelBufferAccess::setPixDepth(PixelBufferAccess *this,float depth,int x,int y,int z)

{
  unsigned_short val;
  deUint32 dVar1;
  float *dst;
  deUint8 *pixelPtr;
  int z_local;
  int y_local;
  int x_local;
  float depth_local;
  PixelBufferAccess *this_local;
  
  dst = (float *)getPixelPtr(this,x,y,z);
  switch((this->super_ConstPixelBufferAccess).m_format.type) {
  case UNSIGNED_INT_16_8_8:
    val = anon_unknown_75::convertSatRte<unsigned_short>(depth * 65535.0);
    anon_unknown_75::writeUint32High16((deUint8 *)dst,val);
    break;
  case UNSIGNED_INT_24_8:
    dVar1 = anon_unknown_75::convertSatRteUint24(depth * 16777215.0);
    anon_unknown_75::writeUint32High24((deUint8 *)dst,dVar1);
    break;
  case UNSIGNED_INT_24_8_REV:
    dVar1 = anon_unknown_75::convertSatRteUint24(depth * 16777215.0);
    anon_unknown_75::writeUint32Low24((deUint8 *)dst,dVar1);
    break;
  default:
    anon_unknown_75::floatToChannel
              ((deUint8 *)dst,depth,(this->super_ConstPixelBufferAccess).m_format.type);
    break;
  case FLOAT_UNSIGNED_INT_24_8_REV:
    *dst = depth;
  }
  return;
}

Assistant:

void PixelBufferAccess::setPixDepth (float depth, int x, int y, int z) const
{
	DE_ASSERT(de::inBounds(x, 0, getWidth()));
	DE_ASSERT(de::inBounds(y, 0, getHeight()));
	DE_ASSERT(de::inBounds(z, 0, getDepth()));

	deUint8* const pixelPtr = (deUint8*)getPixelPtr(x, y, z);

	switch (m_format.type)
	{
		case TextureFormat::UNSIGNED_INT_16_8_8:
			DE_ASSERT(m_format.order == TextureFormat::DS);
			writeUint32High16(pixelPtr, convertSatRte<deUint16>(depth * 65535.0f));
			break;

		case TextureFormat::UNSIGNED_INT_24_8:
			DE_ASSERT(m_format.order == TextureFormat::D || m_format.order == TextureFormat::DS);
			writeUint32High24(pixelPtr,  convertSatRteUint24(depth * 16777215.0f));
			break;

		case TextureFormat::UNSIGNED_INT_24_8_REV:
			DE_ASSERT(m_format.order == TextureFormat::D || m_format.order == TextureFormat::DS);
			writeUint32Low24(pixelPtr,  convertSatRteUint24(depth * 16777215.0f));
			break;

		case TextureFormat::FLOAT_UNSIGNED_INT_24_8_REV:
			DE_ASSERT(m_format.order == TextureFormat::DS);
			*((float*)pixelPtr) = depth;
			break;

		default:
			DE_ASSERT(m_format.order == TextureFormat::D); // no other combined depth stencil types
			floatToChannel(pixelPtr, depth, m_format.type);
			break;
	}
}